

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::ModelProto::MergeFrom(ModelProto *this,ModelProto *from)

{
  uint uVar1;
  InternalMetadata *this_00;
  ModelProto *in_RSI;
  uint32 cached_has_bits;
  string *in_stack_fffffffffffffef8;
  ModelProto *in_stack_ffffffffffffff00;
  ExtensionSet *in_stack_ffffffffffffff48;
  ExtensionSet *in_stack_ffffffffffffff50;
  TrainerSpec *in_stack_ffffffffffffff70;
  TrainerSpec *in_stack_ffffffffffffff78;
  
  google::protobuf::internal::ExtensionSet::MergeFrom
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this_00 = &(in_RSI->super_MessageLite)._internal_metadata_;
  if (((uint)this_00->ptr_ & 1) == 1) {
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
    }
    else {
      (*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              ((InternalMetadata *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::MergeFrom
            ((RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *)in_stack_ffffffffffffff00,
             (RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *)in_stack_fffffffffffffef8)
  ;
  uVar1 = (in_RSI->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_mutable_trainer_spec(in_stack_ffffffffffffff00);
      _internal_trainer_spec(in_RSI);
      TrainerSpec::MergeFrom(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    if ((uVar1 & 2) != 0) {
      _internal_mutable_normalizer_spec(in_stack_ffffffffffffff00);
      _internal_normalizer_spec(in_RSI);
      NormalizerSpec::MergeFrom
                ((NormalizerSpec *)in_stack_ffffffffffffff78,
                 (NormalizerSpec *)in_stack_ffffffffffffff70);
    }
    if ((uVar1 & 4) != 0) {
      in_stack_ffffffffffffff00 =
           (ModelProto *)_internal_mutable_self_test_data(in_stack_ffffffffffffff00);
      _internal_self_test_data(in_RSI);
      SelfTestData::MergeFrom
                ((SelfTestData *)in_stack_ffffffffffffff78,(SelfTestData *)in_stack_ffffffffffffff70
                );
    }
    if ((uVar1 & 8) != 0) {
      _internal_mutable_denormalizer_spec(in_stack_ffffffffffffff00);
      _internal_denormalizer_spec(in_RSI);
      NormalizerSpec::MergeFrom
                ((NormalizerSpec *)in_stack_ffffffffffffff78,
                 (NormalizerSpec *)in_stack_ffffffffffffff70);
    }
  }
  return;
}

Assistant:

void ModelProto::MergeFrom(const ModelProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.ModelProto)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  pieces_.MergeFrom(from.pieces_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_mutable_trainer_spec()->::sentencepiece::TrainerSpec::MergeFrom(from._internal_trainer_spec());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_normalizer_spec()->::sentencepiece::NormalizerSpec::MergeFrom(from._internal_normalizer_spec());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_mutable_self_test_data()->::sentencepiece::SelfTestData::MergeFrom(from._internal_self_test_data());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_denormalizer_spec()->::sentencepiece::NormalizerSpec::MergeFrom(from._internal_denormalizer_spec());
    }
  }
}